

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O1

char * __thiscall
Memory::LargeHeapBucket::PageHeapAlloc
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,size_t size,
          ObjectInfoBits attributes,PageHeapMode mode,bool nothrow)

{
  size_t *psVar1;
  PageHeapMode PVar2;
  Boolean BVar3;
  HeapBlockType HVar4;
  undefined4 *puVar5;
  HeapInfo *this_00;
  code *pcVar6;
  size_t sVar7;
  char *lpAddress;
  bool bVar8;
  uint uVar9;
  BOOL BVar10;
  HeapAllocator *pHVar11;
  PageHeapData *this_01;
  char *pcVar12;
  LargeHeapBlock *this_02;
  Recycler *pRVar13;
  IdleDecommitPageAllocator *pIVar14;
  undefined6 in_register_00000082;
  type_info *ptVar15;
  LargeHeapBucket *pLVar16;
  undefined8 *in_FS_OFFSET;
  pointer_____offset_0x10___ *local_b0;
  size_t actualPageCount;
  size_t local_a0;
  char *local_98;
  DWORD local_90;
  DWORD local_84;
  long lStack_80;
  DWORD oldProtect;
  char *local_78;
  Segment *local_70;
  Segment *segment;
  size_t local_60;
  IdleDecommitPageAllocator *local_58;
  char *local_50;
  Recycler *local_48;
  LargeHeapBucket *local_40;
  type_info *local_38;
  
  local_40 = this;
  pHVar11 = HeapAllocator::GetNoMemProtectInstance();
  local_b0 = &PageHeapData::typeinfo;
  actualPageCount = 0;
  local_a0 = 0xffffffffffffffff;
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
  ;
  local_90 = 0x7a;
  pHVar11 = HeapAllocator::TrackAllocInfo(pHVar11,(TrackAllocData *)&stack0xffffffffffffff50);
  this_01 = (PageHeapData *)HeapAllocator::AllocT<true>(pHVar11,0x48);
  this_01->isLockedWithPageHeap = false;
  this_01->isGuardPageDecommitted = false;
  this_01->pageHeapMode = PageHeapModeOff;
  this_01->field_0x3 = 0;
  this_01->actualPageCount = 0;
  this_01->paddingBytes = 0;
  this_01->unusedBytes = 0;
  *(undefined4 *)&this_01->field_0xc = 0;
  this_01->guardPageAddress = (char *)0x0;
  this_01->objectAddress = (char *)0x0;
  this_01->objectEndAddr = (char *)0x0;
  this_01->objectPageAddr = (char *)0x0;
  this_01->lastMarkedBy = (char *)0x0;
  this_01->pageHeapAllocStack = (StackBackTrace *)0x0;
  this_01->pageHeapFreeStack = (StackBackTrace *)0x0;
  if (this_01 == (PageHeapData *)0x0) {
    if (!nothrow) {
      Recycler::OutOfMemory(recycler);
    }
    return (char *)0x0;
  }
  uVar9 = (uint)CONCAT62(in_register_00000082,attributes);
  segment._4_4_ = uVar9 | 0x20;
  if (7 < size) {
    segment._4_4_ = uVar9;
  }
  if (recycler->verifyEnabled == false) {
    sizeCat = size;
  }
  local_60 = sizeCat;
  local_38 = (type_info *)LargeHeapBlock::GetPagesNeeded(sizeCat,false);
  pLVar16 = local_40;
  if (local_38 == (type_info *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)*in_FS_OFFSET;
    *puVar5 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x8f,"(pageCount != 0)","pageCount != 0");
    if (!bVar8) goto LAB_0024d4fd;
    *puVar5 = 0;
  }
  local_b0 = (pointer_____offset_0x10___ *)(local_38 + 1);
  local_48 = recycler;
  local_58 = HeapInfo::GetRecyclerLargeBlockPageAllocator((pLVar16->super_HeapBucket).heapInfo);
  pcVar12 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::Alloc(&local_58->super_PageAllocator,(size_t *)&stack0xffffffffffffff50,&local_70);
  if (((ulong)pcVar12 & 0xfff) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)*in_FS_OFFSET;
    *puVar5 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x94,"((size_t)baseAddress%AutoSystemInfo::PageSize == 0)",
                       "(size_t)baseAddress%AutoSystemInfo::PageSize == 0");
    if (!bVar8) goto LAB_0024d4fd;
    *puVar5 = 0;
  }
  if (pcVar12 == (char *)0x0) {
LAB_0024d2a7:
    pHVar11 = HeapAllocator::GetNoMemProtectInstance();
    PageHeapData::~PageHeapData(this_01);
    HeapAllocator::Free(pHVar11,this_01,0x48);
    pRVar13 = local_48;
  }
  else {
    lStack_80 = (long)local_b0 - (long)local_38;
    PVar2 = ((pLVar16->super_HeapBucket).heapInfo)->pageHeapMode;
    this_01->pageHeapMode = PVar2;
    if (PVar2 == PageHeapModeBlockEnd) {
      uVar9 = -(int)local_60 & 0xf;
      this_01->unusedBytes = (ushort)uVar9;
      uVar9 = -(uVar9 + (int)local_60) - 0x20;
      this_01->paddingBytes = (ushort)uVar9 & 0xfff;
      if ((uVar9 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)*in_FS_OFFSET;
        *puVar5 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                           ,0xae,
                           "(pageHeapData->paddingBytes%HeapConstants::ObjectGranularity == 0)",
                           "pageHeapData->paddingBytes%HeapConstants::ObjectGranularity == 0");
        if (!bVar8) goto LAB_0024d4fd;
        *puVar5 = 0;
      }
      local_78 = pcVar12 + this_01->paddingBytes;
      local_50 = pcVar12 + (long)local_38 * 0x1000;
      this_01->objectPageAddr = pcVar12;
    }
    else if (PVar2 == PageHeapModeBlockStart) {
      local_78 = pcVar12 + lStack_80 * 0x1000;
      this_01->paddingBytes = 0;
      this_01->unusedBytes = 0xfe0U - (short)local_60 & 0xfff;
      this_01->objectPageAddr = local_78;
      local_50 = pcVar12;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)*in_FS_OFFSET;
      *puVar5 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0xb7,"(false)","false");
      if (!bVar8) goto LAB_0024d4fd;
      *puVar5 = 0;
      local_78 = (char *)0x0;
      local_50 = (char *)0x0;
    }
    ptVar15 = local_38;
    pLVar16 = local_40;
    this_02 = LargeHeapBlock::New(local_78,(size_t)local_38,local_70,1,local_40);
    lpAddress = local_50;
    pIVar14 = local_58;
    if (this_02 == (LargeHeapBlock *)0x0) {
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::SuspendIdleDecommit(&local_58->super_PageAllocator);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::Release(&pIVar14->super_PageAllocator,pcVar12,(size_t)local_b0,local_70);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ResumeIdleDecommit(&pIVar14->super_PageAllocator);
      goto LAB_0024d2a7;
    }
    if (this_01->pageHeapMode == PageHeapModeBlockStart) {
      ptVar15 = (type_info *)local_b0;
    }
    this_02->addressEnd = pcVar12 + (long)ptVar15 * 0x1000;
    this_01->actualPageCount = (uint)local_b0;
    this_01->guardPageAddress = local_50;
    this_02->heapInfo = (pLVar16->super_HeapBucket).heapInfo;
    this_02->pageHeapData = this_01;
    pRVar13 = HeapBucket::GetRecycler(&pLVar16->super_HeapBucket);
    sVar7 = local_60;
    BVar3 = pRVar13->recyclerFlagsTable->PageHeapDecommitGuardPage;
    this_00 = (pLVar16->super_HeapBucket).heapInfo;
    HVar4 = (this_02->super_HeapBlock).heapBlockType;
    if (HVar4 < 0xc) {
      if ((0x630U >> (HVar4 & 0x1f) & 1) == 0) {
        if ((0x84U >> (HVar4 & 0x1f) & 1) == 0) {
          if (HVar4 != 0xb) goto LAB_0024d30d;
          pIVar14 = HeapInfo::GetRecyclerLargeBlockPageAllocator(this_00);
        }
        else {
          pIVar14 = HeapInfo::GetRecyclerLeafPageAllocator(this_00);
        }
      }
      else {
        pIVar14 = HeapInfo::GetRecyclerWithBarrierPageAllocator(this_00);
      }
    }
    else {
LAB_0024d30d:
      pIVar14 = HeapInfo::GetRecyclerPageAllocator(this_00);
    }
    if (BVar3 == false && (pIVar14->super_PageAllocator).disablePageReuse == false) {
      BVar10 = VirtualProtect(lpAddress,lStack_80 << 0xc,1,&local_84);
      if (BVar10 == 0) goto LAB_0024d4ff;
      this_01->isGuardPageDecommitted = false;
    }
    else {
      BVar10 = VirtualFree(lpAddress,lStack_80 << 0xc,0x4000);
      if (BVar10 == 0) {
LAB_0024d4ff:
        Js::Throw::FatalInternalError(-0x7fffbffb);
      }
      this_01->isGuardPageDecommitted = true;
    }
    pLVar16 = local_40;
    pRVar13 = local_48;
    pcVar12 = LargeHeapBlock::Alloc(this_02,sVar7,segment._4_2_);
    this_01->objectAddress = pcVar12;
    if (pcVar12 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)*in_FS_OFFSET;
      *puVar5 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0xf6,"(pageHeapData->objectAddress != nullptr)",
                         "pageHeapData->objectAddress != nullptr");
      if (!bVar8) {
LAB_0024d4fd:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar5 = 0;
      pLVar16 = local_40;
    }
    pIVar14 = local_58;
    sVar7 = local_60;
    if (this_01->objectAddress == (char *)0x0) {
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::SuspendIdleDecommit(&local_58->super_PageAllocator);
      LargeHeapBlock::ReleasePages(this_02,pRVar13);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ResumeIdleDecommit(&pIVar14->super_PageAllocator);
      LargeHeapBlock::Delete(this_02);
    }
    else {
      this_01->objectEndAddr = this_01->objectAddress + local_60;
      memset(this_01->objectPageAddr,0xf0,(ulong)this_01->paddingBytes);
      memset(this_01->objectAddress + sVar7,0xf0,(ulong)this_01->unusedBytes);
      ptVar15 = local_38;
      bVar8 = HeapBlockMap64::SetHeapBlock
                        (&pRVar13->heapBlockMap,local_78,(size_t)local_38,&this_02->super_HeapBlock,
                         LargeBlockType,'\0');
      pIVar14 = local_58;
      if (bVar8) {
        this_02->next = pLVar16->largePageHeapBlockList;
        pLVar16->largePageHeapBlockList = this_02;
        psVar1 = &(pRVar13->autoHeap).uncollectedNewPageCount;
        *psVar1 = (size_t)(ptVar15 + *psVar1);
        psVar1 = ((pLVar16->super_HeapBucket).heapInfo)->heapBlockCount + 0xb;
        *psVar1 = *psVar1 + 1;
        if (pRVar13->capturePageHeapAllocStack == true) {
          LargeHeapBlock::CapturePageHeapAllocStack(this_02);
        }
        pcVar12 = this_01->objectAddress;
        if (pcVar12 != (char *)0x0 || nothrow) {
          return pcVar12;
        }
        goto LAB_0024d2d3;
      }
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::SuspendIdleDecommit(&local_58->super_PageAllocator);
      LargeHeapBlock::ReleasePages(this_02,pRVar13);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ResumeIdleDecommit(&pIVar14->super_PageAllocator);
      LargeHeapBlock::Delete(this_02);
    }
  }
  pcVar12 = (char *)0x0;
  if (nothrow) {
    return (char *)0x0;
  }
LAB_0024d2d3:
  Recycler::OutOfMemory(pRVar13);
  return pcVar12;
}

Assistant:

char*
LargeHeapBucket::PageHeapAlloc(Recycler * recycler, size_t sizeCat, size_t size, ObjectInfoBits attributes, PageHeapMode mode, bool nothrow)
{
    auto throwOrReturn = [&](char* memBlock) ->char*
    {
        if (memBlock==nullptr && !nothrow)
        {
            recycler->OutOfMemory();
        }
        return memBlock;
    };

    PageHeapData* pageHeapData = NoMemProtectHeapNewNoThrowZ(PageHeapData);
    if (pageHeapData == nullptr)
    {
        return throwOrReturn(nullptr);
    }


    if (size < sizeof(void*))
    {
        attributes = (ObjectInfoBits)(attributes | LeafBit);
    }

#ifdef RECYCLER_MEMORY_VERIFY
    if (recycler->VerifyEnabled())
    {
        // with recycler verify enabled, it uses the unaligned bytes
        size = sizeCat;
    }
#endif

    size_t pageCount = LargeHeapBlock::GetPagesNeeded(size, false);
    Assert(pageCount != 0);
    size_t actualPageCount = pageCount + 1; // 1 for guard page
    auto pageAllocator = heapInfo->GetRecyclerLargeBlockPageAllocator();
    Segment * segment;
    char * baseAddress = pageAllocator->Alloc(&actualPageCount, &segment);
    Assert((size_t)baseAddress%AutoSystemInfo::PageSize == 0);
    if (baseAddress == nullptr)
    {
        NoMemProtectHeapDelete(pageHeapData);
        return throwOrReturn(nullptr);
    }

    size_t guardPageCount = actualPageCount - pageCount; // pageAllocator can return more than asked pages
    char* headerAddress = nullptr;
    char* guardPageAddress = nullptr;
    size_t sizeWithHeader = size + sizeof(LargeObjectHeader);
    pageHeapData->pageHeapMode = heapInfo->pageHeapMode;
    if (pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockStart)
    {
        headerAddress = baseAddress + AutoSystemInfo::PageSize * guardPageCount;
        guardPageAddress = baseAddress;

        pageHeapData->paddingBytes = 0;
        pageHeapData->unusedBytes = (AutoSystemInfo::PageSize - (sizeWithHeader%AutoSystemInfo::PageSize)) % AutoSystemInfo::PageSize;

        pageHeapData->objectPageAddr = headerAddress;
    }
    else if (pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockEnd)
    {
        pageHeapData->unusedBytes = (HeapConstants::ObjectGranularity - (sizeWithHeader%HeapConstants::ObjectGranularity)) % HeapConstants::ObjectGranularity;
        pageHeapData->paddingBytes = (ushort)((AutoSystemInfo::PageSize - pageHeapData->unusedBytes - sizeWithHeader%AutoSystemInfo::PageSize) % AutoSystemInfo::PageSize);
        Assert(pageHeapData->paddingBytes%HeapConstants::ObjectGranularity == 0);

        headerAddress = baseAddress + pageHeapData->paddingBytes;
        guardPageAddress = baseAddress + pageCount * AutoSystemInfo::PageSize;

        pageHeapData->objectPageAddr = baseAddress;
    }
    else
    {
        AnalysisAssert(false);
    }

    LargeHeapBlock * heapBlock = LargeHeapBlock::New(headerAddress, pageCount, segment, 1, this);
    if (!heapBlock)
    {
        pageAllocator->SuspendIdleDecommit();
        pageAllocator->Release(baseAddress, actualPageCount, segment);
        pageAllocator->ResumeIdleDecommit();
        NoMemProtectHeapDelete(pageHeapData);
        return throwOrReturn(nullptr);
    }


    // adjust the addressEnd
    if (pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockStart)
    {
        heapBlock->addressEnd = baseAddress + AutoSystemInfo::PageSize * actualPageCount;
    }
    else
    {
        heapBlock->addressEnd = baseAddress + AutoSystemInfo::PageSize * pageCount;
    }

    pageHeapData->actualPageCount = (uint)actualPageCount;
    pageHeapData->guardPageAddress = guardPageAddress;

    heapBlock->heapInfo = this->heapInfo;
    heapBlock->pageHeapData = pageHeapData;
    
    bool decommitGuardPage = true;
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    decommitGuardPage = this->GetRecycler()->GetRecyclerFlagsTable().PageHeapDecommitGuardPage;
#if defined(RECYCLER_NO_PAGE_REUSE)
    decommitGuardPage |= heapBlock->GetPageAllocator(heapInfo)->IsPageReuseDisabled();
#endif
#endif
    if (decommitGuardPage)
    {
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
        if (VirtualFree(guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, MEM_DECOMMIT))
        {
            pageHeapData->isGuardPageDecommitted = true;
        }
        else
        {
            Js::Throw::FatalInternalError();
        }
    }
    else
    {
        DWORD oldProtect;
        if (VirtualProtect(guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, PAGE_NOACCESS, &oldProtect))
        {
            pageHeapData->isGuardPageDecommitted = false;
        }
        else
        {
            Js::Throw::FatalInternalError();
        }        
    }

    pageHeapData->objectAddress = heapBlock->Alloc(size, attributes);
    Assert(pageHeapData->objectAddress != nullptr);
    if (!pageHeapData->objectAddress)
    {
        pageAllocator->SuspendIdleDecommit();
        heapBlock->ReleasePages(recycler);
        pageAllocator->ResumeIdleDecommit();
        LargeHeapBlock::Delete(heapBlock);
        return throwOrReturn(nullptr);
    }

    pageHeapData->objectEndAddr = pageHeapData->objectAddress + size;

    // fill pattern before set pageHeapMode, so background scan stack may verify the pattern
    memset(pageHeapData->objectPageAddr, PageHeapMemFill, pageHeapData->paddingBytes);
    memset(pageHeapData->objectAddress + size, PageHeapMemFill, pageHeapData->unusedBytes);

    if (!recycler->heapBlockMap.SetHeapBlock(headerAddress, pageCount, heapBlock, HeapBlock::HeapBlockType::LargeBlockType, 0))
    {
        pageAllocator->SuspendIdleDecommit();
        heapBlock->ReleasePages(recycler);
        pageAllocator->ResumeIdleDecommit();
        LargeHeapBlock::Delete(heapBlock);
        return throwOrReturn(nullptr);
    }

    heapBlock->SetNextBlock(this->largePageHeapBlockList);
    this->largePageHeapBlockList = heapBlock;

#if ENABLE_PARTIAL_GC
    recycler->autoHeap.uncollectedNewPageCount += pageCount;
#endif

    RECYCLER_SLOW_CHECK(this->heapInfo->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]++);
    RECYCLER_PERF_COUNTER_ADD(FreeObjectSize, heapBlock->GetPageCount() * AutoSystemInfo::PageSize);

#ifdef STACK_BACK_TRACE
    if (recycler->ShouldCapturePageHeapAllocStack())
    {
        heapBlock->CapturePageHeapAllocStack();
    }
#endif

    return throwOrReturn(pageHeapData->objectAddress);
}